

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O1

void randomx::generateSuperscalar(SuperscalarProgram *prog,Blake2Generator *gen)

{
  byte bVar1;
  byte bVar2;
  pointer pMVar3;
  SuperscalarInstructionInfo *pSVar4;
  bool bVar5;
  int cycle;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  uint8_t uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  RegisterInfo *pRVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int topCycle;
  SuperscalarInstruction currentInstruction;
  RegisterInfo registers [8];
  type portBusy [174] [3];
  int local_970;
  uint local_96c;
  int local_94c;
  int local_948;
  int local_944;
  int local_930;
  int local_92c;
  DecoderBuffer *local_928;
  SuperscalarInstruction local_918;
  SuperscalarProgram *local_8e8;
  ulong local_8e0;
  RegisterInfo local_8d8 [8];
  type local_858 [522];
  
  lVar11 = 0;
  local_8e8 = prog;
  memset(local_858,0,0x828);
  do {
    *(undefined8 *)((long)&local_8d8[0].latency + lVar11) = 0xffffffff00000000;
    *(undefined8 *)((long)&local_8d8[0].lastOpPar + lVar11) = 0xffffffff;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x80);
  local_918._34_6_ = uRam0000000000123c02;
  local_918._32_2_ = DAT_00123c00;
  local_918.info_ =
       (SuperscalarInstructionInfo *)
       CONCAT44(SuperscalarInstruction::Null._4_4_,(undefined4)SuperscalarInstruction::Null);
  local_918.dst_ = DAT_00123be8._4_4_;
  local_918.src_ = (int)DAT_00123be8;
  local_918.mod_ = _DAT_00123bf0;
  local_918.imm32_ = DAT_00123bf0_4;
  local_918.opGroup_ = (SuperscalarInstructionType)uRam0000000000123bf8;
  local_918.opGroupPar_ = uRam0000000000123bf8._4_4_;
  uVar20 = 0;
  local_928 = (DecoderBuffer *)DecoderBuffer::Default;
  local_948 = 0;
  local_92c = 0;
  iVar9 = 0;
  local_944 = 0;
  local_970 = 0;
  local_8e0 = 0;
  local_94c = 0;
  local_96c = 0;
  bVar12 = false;
  local_930 = 0;
  do {
    local_928 = DecoderBuffer::fetchNext
                          (local_928,(local_918.info_)->type_,(int)local_8e0,local_94c,gen);
    iVar15 = 0;
    do {
      if (local_928->opsCount_ <= iVar15) break;
      iVar19 = iVar9;
      bVar5 = bVar12;
      if ((int)uVar20 <
          (int)((ulong)((long)((local_918.info_)->ops_).
                              super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)((local_918.info_)->ops_).
                             super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
LAB_00114dcf:
        pSVar4 = local_918.info_;
        iVar18 = (int)uVar20;
        pMVar3 = ((local_918.info_)->ops_).
                 super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl.
                 super__Vector_impl_data._M_start;
        cycle = local_944;
        if (local_944 < iVar9) {
          cycle = iVar9;
        }
        if (pMVar3[iVar18].dependent_ == false) {
          cycle = iVar9;
        }
        iVar7 = pMVar3[iVar18].uop1_;
        if (iVar7 != 0) {
          iVar16 = pMVar3[iVar18].uop2_;
          if (iVar16 == 0) {
            cycle = scheduleUop<false>(iVar7,(type (*) [174] [3])local_858,cycle);
          }
          else {
            iVar10 = cycle;
            if (cycle < 0xae) {
              do {
                cycle = scheduleUop<false>(iVar7,(type (*) [174] [3])local_858,iVar10);
                iVar6 = scheduleUop<false>(iVar16,(type (*) [174] [3])local_858,iVar10);
                if (cycle == iVar6 && -1 < cycle) goto LAB_00114ebb;
                iVar10 = iVar10 + 1;
              } while (iVar10 != 0xae);
              cycle = -1;
            }
            else {
              cycle = -1;
            }
          }
        }
LAB_00114ebb:
        iVar7 = 6;
        bVar5 = true;
        if (-1 < cycle) {
          if (iVar18 == pSVar4->srcOp_) {
            iVar19 = iVar9 + 4;
            iVar16 = 0;
            do {
              bVar5 = SuperscalarInstruction::selectSource(&local_918,cycle + iVar16,&local_8d8,gen)
              ;
              if (bVar5) {
                iVar19 = iVar9 + iVar16;
                cycle = cycle + iVar16;
                goto LAB_00114f4a;
              }
              iVar16 = iVar16 + 1;
            } while (iVar16 != 4);
            iVar16 = 4;
            cycle = cycle + 4;
LAB_00114f4a:
            iVar7 = 0;
            if (iVar16 == 4) {
              if (local_970 < 0x100) {
                local_970 = local_970 + 1;
                uVar20 = (ulong)((long)((local_918.info_)->ops_).
                                       super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)((local_918.info_)->ops_).
                                      super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 5;
                iVar7 = 5;
              }
              else {
                local_918._32_2_ = DAT_00123c00;
                local_918.mod_ = _DAT_00123bf0;
                local_918.imm32_ = DAT_00123bf0_4;
                local_918.opGroup_ = (SuperscalarInstructionType)uRam0000000000123bf8;
                local_918.opGroupPar_ = uRam0000000000123bf8._4_4_;
                local_918.info_ =
                     (SuperscalarInstructionInfo *)
                     CONCAT44(SuperscalarInstruction::Null._4_4_,
                              (undefined4)SuperscalarInstruction::Null);
                local_918.dst_ = DAT_00123be8._4_4_;
                local_918.src_ = (int)DAT_00123be8;
                iVar7 = 6;
              }
            }
            bVar5 = bVar12;
            if (iVar16 == 4) goto LAB_00115288;
          }
          if ((int)uVar20 == (local_918.info_)->dstOp_) {
            iVar16 = iVar19 + 4;
            iVar10 = 0;
            do {
              iVar6 = cycle + iVar10;
              bVar5 = SuperscalarInstruction::selectDestination
                                (&local_918,iVar6,0 < local_970,&local_8d8,gen);
              if (bVar5) {
                iVar16 = iVar19 + iVar10;
                goto LAB_00115033;
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 != 4);
            iVar6 = cycle + 4;
            iVar10 = 4;
LAB_00115033:
            iVar7 = 0;
            if (iVar10 == 4) {
              if (local_970 < 0x100) {
                local_970 = local_970 + 1;
                uVar20 = (ulong)((long)((local_918.info_)->ops_).
                                       super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)((local_918.info_)->ops_).
                                      super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 5;
                iVar7 = 5;
              }
              else {
                local_918._32_2_ = DAT_00123c00;
                local_918.mod_ = _DAT_00123bf0;
                local_918.imm32_ = DAT_00123bf0_4;
                local_918.opGroup_ = (SuperscalarInstructionType)uRam0000000000123bf8;
                local_918.opGroupPar_ = uRam0000000000123bf8._4_4_;
                local_918.info_ =
                     (SuperscalarInstructionInfo *)
                     CONCAT44(SuperscalarInstruction::Null._4_4_,
                              (undefined4)SuperscalarInstruction::Null);
                local_918.dst_ = DAT_00123be8._4_4_;
                local_918.src_ = (int)DAT_00123be8;
                iVar7 = 6;
              }
            }
            cycle = iVar6;
            bVar5 = bVar12;
            iVar19 = iVar16;
            if (iVar10 == 4) goto LAB_00115288;
          }
          iVar7 = pMVar3[iVar18].uop1_;
          if (iVar7 != 0) {
            iVar16 = pMVar3[iVar18].uop2_;
            if (iVar16 == 0) {
              cycle = scheduleUop<true>(iVar7,(type (*) [174] [3])local_858,cycle);
            }
            else {
              iVar10 = cycle;
              if (cycle < 0xae) {
                do {
                  cycle = scheduleUop<false>(iVar7,(type (*) [174] [3])local_858,iVar10);
                  iVar6 = scheduleUop<false>(iVar16,(type (*) [174] [3])local_858,iVar10);
                  if (cycle == iVar6 && -1 < cycle) {
                    scheduleUop<true>(iVar7,(type (*) [174] [3])local_858,cycle);
                    scheduleUop<true>(iVar16,(type (*) [174] [3])local_858,iVar6);
                    goto LAB_00115187;
                  }
                  iVar10 = iVar10 + 1;
                } while (iVar10 != 0xae);
                cycle = -1;
              }
              else {
                cycle = -1;
              }
            }
          }
LAB_00115187:
          iVar7 = 6;
          if (cycle < 0) {
            local_970 = 0;
            bVar5 = true;
          }
          else {
            local_944 = pMVar3[iVar18].latency_ + cycle;
            if ((int)uVar20 == (local_918.info_)->resultOp_) {
              local_8d8[local_918.dst_].latency = local_944;
              local_8d8[local_918.dst_].lastOpGroup = local_918.opGroup_;
              local_8d8[local_918.dst_].lastOpPar = local_918.opGroupPar_;
              local_930 = local_944;
            }
            local_948 = local_948 + pMVar3[iVar18].size_;
            iVar15 = iVar15 + 1;
            uVar8 = (int)uVar20 + 1;
            uVar20 = (ulong)uVar8;
            local_92c = local_92c + 1;
            if (0xa9 < cycle) {
              bVar12 = true;
            }
            local_970 = 0;
            if ((int)((ulong)((long)((local_918.info_)->ops_).
                                    super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)((local_918.info_)->ops_).
                                   super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5) <= (int)uVar8) {
              lVar11 = (long)(int)local_96c;
              local_8e8->programBuffer[lVar11].opcode = (char)(local_918.info_)->type_;
              local_8e8->programBuffer[lVar11].dst = (uint8_t)local_918.dst_;
              uVar13 = (uint8_t)local_918.src_;
              if (local_918.src_ < 0) {
                uVar13 = (uint8_t)local_918.dst_;
              }
              local_8e8->programBuffer[lVar11].src = uVar13;
              local_8e8->programBuffer[lVar11].mod = (uint8_t)local_918.mod_;
              local_8e8->programBuffer[lVar11].imm32 = local_918.imm32_;
              if ((0xd < (uint)(local_918.info_)->type_) ||
                 (iVar19 = 1, (0x3808U >> ((local_918.info_)->type_ & 0x1f) & 1) == 0)) {
                iVar19 = 0;
              }
              local_96c = local_96c + 1;
              local_94c = local_94c + iVar19;
            }
            iVar7 = 0;
            bVar5 = bVar12;
            iVar19 = iVar9;
          }
        }
      }
      else {
        iVar7 = 6;
        if ((!bVar12) && ((int)local_96c < 0x200)) {
          SuperscalarInstruction::createForSlot
                    (&local_918,gen,local_928->counts_[iVar15],local_928->index_,
                     local_928->opsCount_ == iVar15 + 1,iVar15 == 0);
          uVar20 = 0;
          goto LAB_00114dcf;
        }
      }
LAB_00115288:
      iVar9 = iVar19;
      bVar12 = bVar5;
    } while (iVar7 != 6);
    pRVar17 = local_8d8;
    uVar8 = (uint)local_8e0 + 1;
    if ((0xa8 < (uint)local_8e0) || (bVar12)) break;
    iVar9 = iVar9 + 1;
    local_8e0 = (ulong)uVar8;
  } while ((int)local_96c < 0x200);
  local_8e8->asicLatencies[4] = 0;
  local_8e8->asicLatencies[5] = 0;
  local_8e8->asicLatencies[6] = 0;
  local_8e8->asicLatencies[7] = 0;
  local_8e8->asicLatencies[0] = 0;
  local_8e8->asicLatencies[1] = 0;
  local_8e8->asicLatencies[2] = 0;
  local_8e8->asicLatencies[3] = 0;
  if (0 < (int)local_96c) {
    uVar20 = 0;
    do {
      bVar1 = local_8e8->programBuffer[uVar20].dst;
      bVar2 = local_8e8->programBuffer[uVar20].src;
      iVar9 = 0;
      if (bVar1 != bVar2) {
        iVar9 = local_8e8->asicLatencies[bVar2] + 1;
      }
      iVar15 = local_8e8->asicLatencies[bVar1] + 1;
      if (iVar15 <= iVar9) {
        iVar15 = iVar9;
      }
      local_8e8->asicLatencies[bVar1] = iVar15;
      uVar20 = uVar20 + 1;
    } while (local_96c != uVar20);
  }
  uVar14 = 0;
  uVar20 = 0;
  iVar9 = 0;
  do {
    if (iVar9 < local_8e8->asicLatencies[uVar14]) {
      uVar20 = uVar14 & 0xffffffff;
      iVar9 = local_8e8->asicLatencies[uVar14];
    }
    local_8e8->cpuLatencies[uVar14] = pRVar17->latency;
    uVar14 = uVar14 + 1;
    pRVar17 = pRVar17 + 1;
  } while (uVar14 != 8);
  local_8e8->size = local_96c;
  local_8e8->addrReg = (int)uVar20;
  local_8e8->cpuLatency = local_930;
  local_8e8->asicLatency = iVar9;
  local_8e8->codeSize = local_948;
  local_8e8->macroOps = local_92c;
  local_8e8->decodeCycles = uVar8;
  local_8e8->ipc = (double)local_92c / (double)local_930;
  local_8e8->mulCount = local_94c;
  return;
}

Assistant:

void generateSuperscalar(SuperscalarProgram& prog, Blake2Generator& gen) {

		ExecutionPort::type portBusy[CYCLE_MAP_SIZE][3];
		memset(portBusy, 0, sizeof(portBusy));
		RegisterInfo registers[8];

		const DecoderBuffer* decodeBuffer = &DecoderBuffer::Default;
		SuperscalarInstruction currentInstruction = SuperscalarInstruction::Null;
		int macroOpIndex = 0;
		int codeSize = 0;
		int macroOpCount = 0;
		int cycle = 0;
		int depCycle = 0;
		int retireCycle = 0;
		bool portsSaturated = false;
		int programSize = 0;
		int mulCount = 0;
		int decodeCycle;
		int throwAwayCount = 0;

		//decode instructions for RANDOMX_SUPERSCALAR_LATENCY cycles or until an execution port is saturated.
		//Each decode cycle decodes 16 bytes of x86 code.
		//Since a decode cycle produces on average 3.45 macro-ops and there are only 3 ALU ports, execution ports are always
		//saturated first. The cycle limit is present only to guarantee loop termination.
		//Program size is limited to SuperscalarMaxSize instructions.
		for (decodeCycle = 0; decodeCycle < RANDOMX_SUPERSCALAR_LATENCY && !portsSaturated && programSize < SuperscalarMaxSize; ++decodeCycle) {

			//select a decode configuration
			decodeBuffer = decodeBuffer->fetchNext(currentInstruction.getType(), decodeCycle, mulCount, gen);
			if (trace) std::cout << "; ------------- fetch cycle " << cycle << " (" << decodeBuffer->getName() << ")" << std::endl;

			int bufferIndex = 0;
			
			//fill all instruction slots in the current decode buffer
			while (bufferIndex < decodeBuffer->getSize()) {
				int topCycle = cycle;

				//if we have issued all macro-ops for the current RandomX instruction, create a new instruction
				if (macroOpIndex >= currentInstruction.getInfo().getSize()) {
					if (portsSaturated || programSize >= SuperscalarMaxSize)
						break;
					//select an instruction so that the first macro-op fits into the current slot
					currentInstruction.createForSlot(gen, decodeBuffer->getCounts()[bufferIndex], decodeBuffer->getIndex(), decodeBuffer->getSize() == bufferIndex + 1, bufferIndex == 0);
					macroOpIndex = 0;
					if (trace) std::cout << "; " << currentInstruction.getInfo().getName() << std::endl;
				}
				const MacroOp& mop = currentInstruction.getInfo().getOp(macroOpIndex);
				if (trace) std::cout << mop.getName() << " ";

				//calculate the earliest cycle when this macro-op (all of its uOPs) can be scheduled for execution
				int scheduleCycle = scheduleMop<false>(mop, portBusy, cycle, depCycle);
				if (scheduleCycle < 0) {
					if (trace) std::cout << "Unable to map operation '" << mop.getName() << "' to execution port (cycle " << cycle << ")" << std::endl;
					//__debugbreak();
					portsSaturated = true;
					break;
				}

				//find a source register (if applicable) that will be ready when this instruction executes
				if (macroOpIndex == currentInstruction.getInfo().getSrcOp()) {
					int forward;
					//if no suitable operand is ready, look up to LOOK_FORWARD_CYCLES forward
					for (forward = 0; forward < LOOK_FORWARD_CYCLES && !currentInstruction.selectSource(scheduleCycle, registers, gen); ++forward) {
						if (trace) std::cout << "; src STALL at cycle " << cycle << std::endl;
						++scheduleCycle;
						++cycle;
					}
					//if no register was found, throw the instruction away and try another one
					if (forward == LOOK_FORWARD_CYCLES) {
						if (throwAwayCount < MAX_THROWAWAY_COUNT) {
							throwAwayCount++;
							macroOpIndex = currentInstruction.getInfo().getSize();
							if (trace) std::cout << "; THROW away " << currentInstruction.getInfo().getName() << std::endl;
							//cycle = topCycle;
							continue;
						}
						//abort this decode buffer
						if (trace) std::cout << "Aborting at cycle " << cycle << " with decode buffer " << decodeBuffer->getName() << " - source registers not available for operation " << currentInstruction.getInfo().getName() << std::endl;
						currentInstruction = SuperscalarInstruction::Null;
						break;
					}
					if (trace) std::cout << "; src = r" << currentInstruction.getSource() << std::endl;
				}
				//find a destination register that will be ready when this instruction executes
				if (macroOpIndex == currentInstruction.getInfo().getDstOp()) {
					int forward;
					for (forward = 0; forward < LOOK_FORWARD_CYCLES && !currentInstruction.selectDestination(scheduleCycle, throwAwayCount > 0, registers, gen); ++forward) {
						if (trace) std::cout << "; dst STALL at cycle " << cycle << std::endl;
						++scheduleCycle;
						++cycle;
					}
					if (forward == LOOK_FORWARD_CYCLES) { //throw instruction away
						if (throwAwayCount < MAX_THROWAWAY_COUNT) {
							throwAwayCount++;
							macroOpIndex = currentInstruction.getInfo().getSize();
							if (trace) std::cout << "; THROW away " << currentInstruction.getInfo().getName() << std::endl;
							//cycle = topCycle;
							continue;
						}
						//abort this decode buffer
						if (trace) std::cout << "Aborting at cycle " << cycle << " with decode buffer " << decodeBuffer->getName() << " - destination registers not available" << std::endl;
						currentInstruction = SuperscalarInstruction::Null;
						break;
					}
					if (trace) std::cout << "; dst = r" << currentInstruction.getDestination() << std::endl;
				}
				throwAwayCount = 0;

				//recalculate when the instruction can be scheduled for execution based on operand availability
				scheduleCycle = scheduleMop<true>(mop, portBusy, scheduleCycle, scheduleCycle);

				if (scheduleCycle < 0) {
					if (trace) std::cout << "Unable to map operation '" << mop.getName() << "' to execution port (cycle " << scheduleCycle << ")" << std::endl;
					portsSaturated = true;
					break;
				}

				//calculate when the result will be ready
				depCycle = scheduleCycle + mop.getLatency();

				//if this instruction writes the result, modify register information
				//  RegisterInfo.latency - which cycle the register will be ready
				//  RegisterInfo.lastOpGroup - the last operation that was applied to the register
				//  RegisterInfo.lastOpPar - the last operation source value (-1 = constant, 0-7 = register)
				if (macroOpIndex == currentInstruction.getInfo().getResultOp()) {
					int dst = currentInstruction.getDestination();
					RegisterInfo& ri = registers[dst];
					retireCycle = depCycle;
					ri.latency = retireCycle;
					ri.lastOpGroup = currentInstruction.getGroup();
					ri.lastOpPar = currentInstruction.getGroupPar();
					if (trace) std::cout << "; RETIRED at cycle " << retireCycle << std::endl;
				}
				codeSize += mop.getSize();
				bufferIndex++;
				macroOpIndex++;
				macroOpCount++;

				//terminating condition
				if (scheduleCycle >= RANDOMX_SUPERSCALAR_LATENCY) {
					portsSaturated = true;
				}
				cycle = topCycle;

				//when all macro-ops of the current instruction have been issued, add the instruction into the program
				if (macroOpIndex >= currentInstruction.getInfo().getSize()) {
					currentInstruction.toInstr(prog(programSize++));
					mulCount += isMultiplication(currentInstruction.getType());
				}
			}
			++cycle;
		}

		double ipc = (macroOpCount / (double)retireCycle);

		memset(prog.asicLatencies, 0, sizeof(prog.asicLatencies));

		//Calculate ASIC latency:
		//Assumes 1 cycle latency for all operations and unlimited parallelization.
		for (int i = 0; i < programSize; ++i) {
			Instruction& instr = prog(i);
			int latDst = prog.asicLatencies[instr.dst] + 1;
			int latSrc = instr.dst != instr.src ? prog.asicLatencies[instr.src] + 1 : 0;
			prog.asicLatencies[instr.dst] = std::max(latDst, latSrc);
		}

		//address register is the register with the highest ASIC latency
		int asicLatencyMax = 0;
		int addressReg = 0;
		for (int i = 0; i < 8; ++i) {
			if (prog.asicLatencies[i] > asicLatencyMax) {
				asicLatencyMax = prog.asicLatencies[i];
				addressReg = i;
			}
			prog.cpuLatencies[i] = registers[i].latency;
		}

		prog.setSize(programSize);
		prog.setAddressRegister(addressReg);

		prog.cpuLatency = retireCycle;
		prog.asicLatency = asicLatencyMax;
		prog.codeSize = codeSize;
		prog.macroOps = macroOpCount;
		prog.decodeCycles = decodeCycle;
		prog.ipc = ipc;
		prog.mulCount = mulCount;
		

		/*if(INFO) std::cout << "; ALU port utilization:" << std::endl;
		if (INFO) std::cout << "; (* = in use, _ = idle)" << std::endl;

		int portCycles = 0;
		for (int i = 0; i < CYCLE_MAP_SIZE; ++i) {
			std::cout << "; " << std::setw(3) << i << " ";
			for (int j = 0; j < 3; ++j) {
				std::cout << (portBusy[i][j] ? '*' : '_');
				portCycles += !!portBusy[i][j];
			}
			std::cout << std::endl;
		}*/
	}